

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

size_t xm_get_memory_needed_for_context(char *moddata,size_t moddata_length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ulong in_RSI;
  long in_RDI;
  uint32_t sample_size;
  uint16_t j;
  uint32_t ins_header_size;
  uint32_t sample_size_aggregate;
  uint16_t num_samples;
  uint16_t i_1;
  uint16_t num_rows;
  uint16_t i;
  uint16_t num_instruments;
  uint16_t num_patterns;
  uint16_t num_channels;
  size_t offset;
  size_t memory_needed;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e4;
  undefined4 local_dc;
  undefined4 local_d4;
  undefined4 local_c4;
  undefined4 local_bc;
  undefined4 local_b4;
  undefined4 local_ac;
  undefined4 local_a4;
  undefined4 local_9c;
  undefined4 local_8c;
  undefined4 local_84;
  undefined4 local_7c;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_68;
  undefined2 local_3a;
  undefined4 local_38;
  undefined4 local_34;
  undefined2 local_2c;
  undefined2 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI < 0x45) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ushort)*(byte *)(in_RDI + 0x44);
  }
  if (in_RSI < 0x46) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ushort)*(byte *)(in_RDI + 0x45);
  }
  uVar1 = uVar1 | uVar2 << 8;
  if (in_RSI < 0x47) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ushort)*(byte *)(in_RDI + 0x46);
  }
  if (in_RSI < 0x48) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ushort)*(byte *)(in_RDI + 0x47);
  }
  uVar2 = uVar2 | uVar4 << 8;
  if (in_RSI < 0x49) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ushort)*(byte *)(in_RDI + 0x48);
  }
  if (in_RSI < 0x4a) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ushort)*(byte *)(in_RDI + 0x49);
  }
  uVar4 = uVar4 | uVar3 << 8;
  if (in_RSI < 0x41) {
    local_68 = 0;
  }
  else {
    local_68 = (uint)*(byte *)(in_RDI + 0x40);
  }
  if (in_RSI < 0x42) {
    local_70 = 0;
  }
  else {
    local_70 = (uint)*(byte *)(in_RDI + 0x41);
  }
  local_18 = (long)(int)((local_68 | local_70 << 8) << 8) +
             (ulong)uVar4 * 0xf8 + (ulong)uVar2 * 0x10;
  if (in_RSI < 0x3d) {
    local_74 = 0;
  }
  else {
    local_74 = (uint)*(byte *)(in_RDI + 0x3c);
  }
  if (in_RSI < 0x3e) {
    local_7c = 0;
  }
  else {
    local_7c = (uint)*(byte *)(in_RDI + 0x3d);
  }
  if (in_RSI < 0x3f) {
    local_84 = 0;
  }
  else {
    local_84 = (uint)*(byte *)(in_RDI + 0x3e);
  }
  if (in_RSI < 0x40) {
    local_8c = 0;
  }
  else {
    local_8c = (uint)*(byte *)(in_RDI + 0x3f);
  }
  local_20 = (ulong)(local_74 | local_7c << 8 | (local_84 | local_8c << 8) << 0x10) + 0x3c;
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    if (local_20 + 5 < in_RSI) {
      uVar3 = (ushort)*(byte *)(in_RDI + 5 + local_20);
    }
    else {
      uVar3 = 0;
    }
    if (local_20 + 6 < in_RSI) {
      uVar5 = (ushort)*(byte *)(in_RDI + 6 + local_20);
    }
    else {
      uVar5 = 0;
    }
    local_18 = (long)(int)((uint)(ushort)(uVar3 | uVar5 << 8) * (uint)uVar1) * 5 + local_18;
    if (local_20 < in_RSI) {
      local_9c = (uint)*(byte *)(in_RDI + local_20);
    }
    else {
      local_9c = 0;
    }
    if (local_20 + 1 < in_RSI) {
      local_a4 = (uint)*(byte *)(in_RDI + 1 + local_20);
    }
    else {
      local_a4 = 0;
    }
    if (local_20 + 2 < in_RSI) {
      local_ac = (uint)*(byte *)(in_RDI + 2 + local_20);
    }
    else {
      local_ac = 0;
    }
    if (local_20 + 3 < in_RSI) {
      local_b4 = (uint)*(byte *)(in_RDI + 3 + local_20);
    }
    else {
      local_b4 = 0;
    }
    if (local_20 + 7 < in_RSI) {
      local_bc = (uint)*(byte *)(in_RDI + 7 + local_20);
    }
    else {
      local_bc = 0;
    }
    if (local_20 + 8 < in_RSI) {
      local_c4 = (uint)*(byte *)(in_RDI + 8 + local_20);
    }
    else {
      local_c4 = 0;
    }
    local_20 = ((local_9c | local_a4 << 8 | (local_ac | local_b4 << 8) << 0x10) +
               (local_bc | local_c4 << 8)) + local_20;
  }
  for (local_2c = 0; local_2c < uVar4; local_2c = local_2c + 1) {
    local_34 = 0;
    if (local_20 + 0x1b < in_RSI) {
      uVar2 = (ushort)*(byte *)(in_RDI + 0x1b + local_20);
    }
    else {
      uVar2 = 0;
    }
    if (local_20 + 0x1c < in_RSI) {
      uVar3 = (ushort)*(byte *)(in_RDI + 0x1c + local_20);
    }
    else {
      uVar3 = 0;
    }
    uVar2 = uVar2 | uVar3 << 8;
    local_18 = (ulong)uVar2 * 0x38 + local_18;
    if (local_20 < in_RSI) {
      local_d4 = (uint)*(byte *)(in_RDI + local_20);
    }
    else {
      local_d4 = 0;
    }
    if (local_20 + 1 < in_RSI) {
      local_dc = (uint)*(byte *)(in_RDI + 1 + local_20);
    }
    else {
      local_dc = 0;
    }
    if (local_20 + 2 < in_RSI) {
      local_e4 = (uint)*(byte *)(in_RDI + 2 + local_20);
    }
    else {
      local_e4 = 0;
    }
    if (local_20 + 3 < in_RSI) {
      local_ec = (uint)*(byte *)(in_RDI + 3 + local_20);
    }
    else {
      local_ec = 0;
    }
    local_38 = local_d4 | local_dc << 8 | (local_e4 | local_ec << 8) << 0x10;
    if ((local_38 == 0) || (0x107 < local_38)) {
      local_38 = 0x107;
    }
    local_20 = local_38 + local_20;
    for (local_3a = 0; local_3a < uVar2; local_3a = local_3a + 1) {
      if (local_20 < in_RSI) {
        local_f0 = (uint)*(byte *)(in_RDI + local_20);
      }
      else {
        local_f0 = 0;
      }
      if (local_20 + 1 < in_RSI) {
        local_f8 = (uint)*(byte *)(in_RDI + 1 + local_20);
      }
      else {
        local_f8 = 0;
      }
      if (local_20 + 2 < in_RSI) {
        local_100 = (uint)*(byte *)(in_RDI + 2 + local_20);
      }
      else {
        local_100 = 0;
      }
      if (local_20 + 3 < in_RSI) {
        local_108 = (uint)*(byte *)(in_RDI + 3 + local_20);
      }
      else {
        local_108 = 0;
      }
      uVar6 = local_f0 | local_f8 << 8 | (local_100 | local_108 << 8) << 0x10;
      local_34 = uVar6 + local_34;
      local_18 = (ulong)uVar6 + local_18;
      local_20 = local_20 + 0x28;
    }
    local_20 = local_34 + local_20;
  }
  return (ulong)uVar1 * 0x138 + local_18 + 0x170;
}

Assistant:

size_t xm_get_memory_needed_for_context(const char* moddata, size_t moddata_length) {
	size_t memory_needed = 0;
	size_t offset = 60; /* Skip the first header */
	uint16_t num_channels;
	uint16_t num_patterns;
	uint16_t num_instruments;

	/* Read the module header */

	num_channels = READ_U16(offset + 8);
	num_patterns = READ_U16(offset + 10);
	memory_needed += num_patterns * sizeof(xm_pattern_t);

	num_instruments = READ_U16(offset + 12);
	memory_needed += num_instruments * sizeof(xm_instrument_t);

	memory_needed += MAX_NUM_ROWS * READ_U16(offset + 4) * sizeof(uint8_t); /* Module length */

	/* Header size */
	offset += READ_U32(offset);

	/* Read pattern headers */
	for(uint16_t i = 0; i < num_patterns; ++i) {
		uint16_t num_rows;

		num_rows = READ_U16(offset + 5);
		memory_needed += num_rows * num_channels * sizeof(xm_pattern_slot_t);

		/* Pattern header length + packed pattern data size */
		offset += READ_U32(offset) + READ_U16(offset + 7);
	}

	/* Read instrument headers */
	for(uint16_t i = 0; i < num_instruments; ++i) {
		uint16_t num_samples;
		uint32_t sample_size_aggregate = 0;

		num_samples = READ_U16(offset + 27);
		memory_needed += num_samples * sizeof(xm_sample_t);

		/* Instrument header size */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;
		offset += ins_header_size;

		for(uint16_t j = 0; j < num_samples; ++j) {
			uint32_t sample_size;

			sample_size = READ_U32(offset);
			sample_size_aggregate += sample_size;
			memory_needed += sample_size;
			offset += 40; /* See comment in xm_load_module() */
		}

		offset += sample_size_aggregate;
	}

	memory_needed += num_channels * sizeof(xm_channel_context_t);
	memory_needed += sizeof(xm_context_t);

	return memory_needed;
}